

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListBindFunction
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference pvVar1;
  pointer pEVar2;
  reference this_00;
  LogicalType *this_01;
  LogicalType local_30;
  
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if ((pEVar2->return_type).id_ == UNKNOWN) {
    LogicalType::LogicalType(&local_30,UNKNOWN);
    this_00 = vector<duckdb::LogicalType,_true>::get<true>
                        (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
    LogicalType::operator=(this_00,&local_30);
    LogicalType::~LogicalType(&local_30);
    LogicalType::LogicalType(&local_30,SQLNULL);
    LogicalType::operator=(&(function->super_BaseScalarFunction).return_type,&local_30);
    LogicalType::~LogicalType(&local_30);
    *(undefined8 *)this = 0;
  }
  else {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar1);
    LogicalType::LIST(&local_30,&pEVar2->return_type);
    this_01 = &(function->super_BaseScalarFunction).return_type;
    LogicalType::operator=(this_01,&local_30);
    LogicalType::~LogicalType(&local_30);
    make_uniq<duckdb::ListBindData,duckdb::LogicalType&>((duckdb *)&local_30,this_01);
    *(undefined8 *)this = local_30._0_8_;
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> ListBindFunction(ClientContext &context, AggregateFunction &function,
                                          vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(arguments.size() == 1);
	D_ASSERT(function.arguments.size() == 1);

	if (arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		function.arguments[0] = LogicalTypeId::UNKNOWN;
		function.return_type = LogicalType::SQLNULL;
		return nullptr;
	}

	function.return_type = LogicalType::LIST(arguments[0]->return_type);
	return make_uniq<ListBindData>(function.return_type);
}